

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::ReplicateVisitor::internalVisit(ReplicateVisitor *this,StuntDouble *sd)

{
  bool bVar1;
  SnapshotManager *this_00;
  Snapshot *this_01;
  shared_ptr<OpenMD::GenericData> *in_RSI;
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
  *in_RDI;
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
  atomInfoList;
  Mat3x3d box;
  Snapshot *currSnapshot;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  Snapshot *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  StuntDouble *in_stack_fffffffffffffed8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  Mat3x3d *in_stack_ffffffffffffff88;
  shared_ptr<OpenMD::AtomData> *in_stack_ffffffffffffff90;
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
  *in_stack_ffffffffffffff98;
  ReplicateVisitor *in_stack_ffffffffffffffa0;
  
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34bcc1);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34bcce);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (allocator<char> *)in_stack_ffffffffffffff00._M_pi);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffed0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34bd46);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_RSI);
    std::shared_ptr<OpenMD::AtomData>::operator=
              ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffed0,
               (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffec8);
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34bdb1);
    bVar1 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffed0,
                            in_stack_fffffffffffffec8);
    if (!bVar1) {
      this_00 = SimInfo::getSnapshotManager
                          ((SimInfo *)
                           in_RDI[2].
                           super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_01 = SnapshotManager::getCurrentSnapshot(this_00);
      Snapshot::getHmat(in_stack_fffffffffffffec8);
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x34be87);
      AtomData::getData((AtomData *)in_stack_fffffffffffffec8);
      std::shared_ptr<OpenMD::AtomData>::shared_ptr
                ((shared_ptr<OpenMD::AtomData> *)this_01,
                 (shared_ptr<OpenMD::AtomData> *)&stack0xfffffffffffffef8);
      replicate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                in_stack_ffffffffffffff88);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34bed0);
      std::
      vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ::~vector(in_RDI);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x34bee4);
    }
  }
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34befc);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34bf09);
  return;
}

Assistant:

void ReplicateVisitor::internalVisit(StuntDouble* sd) {
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;

    // if there is not atom data, just skip it
    data = sd->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) { return; }
    } else {
      return;
    }

    Snapshot* currSnapshot = info->getSnapshotManager()->getCurrentSnapshot();
    Mat3x3d box            = currSnapshot->getHmat();

    std::vector<std::shared_ptr<AtomInfo>> atomInfoList = atomData->getData();

    replicate(atomInfoList, atomData, box);
  }